

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)17>_> *
vkt::FragmentOperations::anon_unknown_0::makeRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkFormat colorFormat)

{
  undefined1 local_d8 [8];
  VkRenderPassCreateInfo renderPassInfo;
  VkSubpassDescription subpassDescription;
  VkAttachmentReference colorAttachmentRef;
  VkAttachmentDescription colorAttachmentDescription;
  VkFormat colorFormat_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  
  colorAttachmentRef.attachment = 0;
  subpassDescription.pPreserveAttachments = (deUint32 *)0x200000000;
  colorAttachmentRef.layout = colorFormat;
  memset(&renderPassInfo.pDependencies,0,0x48);
  renderPassInfo.pDependencies._4_4_ = 0;
  subpassDescription.pInputAttachments._0_4_ = 1;
  subpassDescription._24_8_ = &subpassDescription.pPreserveAttachments;
  local_d8._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassInfo._4_4_ = 0;
  renderPassInfo.pNext._0_4_ = 0;
  renderPassInfo.pNext._4_4_ = 1;
  renderPassInfo._16_8_ = &colorAttachmentRef;
  renderPassInfo.pAttachments._0_4_ = 1;
  renderPassInfo._32_8_ = &renderPassInfo.pDependencies;
  renderPassInfo.pSubpasses._0_4_ = 0;
  renderPassInfo.dependencyCount = 0;
  renderPassInfo._52_4_ = 0;
  ::vk::createRenderPass
            (__return_storage_ptr__,vk,device,(VkRenderPassCreateInfo *)local_d8,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> makeRenderPass (const DeviceInterface&	vk,
								   const VkDevice			device,
								   const VkFormat			colorFormat)
{
	const VkAttachmentDescription colorAttachmentDescription =
	{
		(VkAttachmentDescriptionFlags)0,					// VkAttachmentDescriptionFlags		flags;
		colorFormat,										// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
		VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout					initialLayout;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout					finalLayout;
	};

	const VkAttachmentReference colorAttachmentRef =
	{
		0u,													// deUint32			attachment;
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL			// VkImageLayout	layout;
	};

	const VkSubpassDescription subpassDescription =
	{
		(VkSubpassDescriptionFlags)0,						// VkSubpassDescriptionFlags		flags;
		VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
		0u,													// deUint32							inputAttachmentCount;
		DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
		1u,													// deUint32							colorAttachmentCount;
		&colorAttachmentRef,								// const VkAttachmentReference*		pColorAttachments;
		DE_NULL,											// const VkAttachmentReference*		pResolveAttachments;
		DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
		0u,													// deUint32							preserveAttachmentCount;
		DE_NULL												// const deUint32*					pPreserveAttachments;
	};

	const VkRenderPassCreateInfo renderPassInfo =
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		(VkRenderPassCreateFlags)0,							// VkRenderPassCreateFlags			flags;
		1u,													// deUint32							attachmentCount;
		&colorAttachmentDescription,						// const VkAttachmentDescription*	pAttachments;
		1u,													// deUint32							subpassCount;
		&subpassDescription,								// const VkSubpassDescription*		pSubpasses;
		0u,													// deUint32							dependencyCount;
		DE_NULL												// const VkSubpassDependency*		pDependencies;
	};

	return createRenderPass(vk, device, &renderPassInfo);
}